

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O2

void __thiscall wabt::interp::Table::Table(Table *this,Store *param_1,TableType *type)

{
  undefined8 uVar1;
  
  (this->super_Extern).super_Object.kind_ = Table;
  *(undefined8 *)&(this->super_Extern).super_Object.finalizer_.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(this->super_Extern).super_Object.finalizer_.super__Function_base._M_functor + 8) = 0;
  (this->super_Extern).super_Object.finalizer_.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->super_Extern).super_Object.finalizer_._M_invoker = (_Invoker_type)0x0;
  (this->super_Extern).super_Object.host_info_ = (void *)0x0;
  (this->super_Extern).super_Object.self_.index = 0;
  (this->super_Extern).super_Object._vptr_Object = (_func_int **)&PTR__Table_001b2048;
  (this->type_).super_ExternType.kind = (type->super_ExternType).kind;
  (this->type_).super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_001b2210;
  uVar1 = *(undefined8 *)((long)&(type->limits).initial + 4);
  *(undefined8 *)&(this->type_).super_ExternType.field_0xc =
       *(undefined8 *)&(type->super_ExternType).field_0xc;
  *(undefined8 *)((long)&(this->type_).limits.initial + 4) = uVar1;
  *(undefined8 *)((long)&(this->type_).limits.max + 2) =
       *(undefined8 *)((long)&(type->limits).max + 2);
  (this->elements_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->elements_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->elements_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::resize
            (&this->elements_,(type->limits).initial);
  return;
}

Assistant:

inline Object::Object(ObjectKind kind) : kind_(kind) {}